

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_35081::OverheadTest_SmallBlocksLargerThanInitial_Test::TestBody
          (OverheadTest_SmallBlocksLargerThanInitial_Test *this)

{
  uintptr_t uVar1;
  pointer *__ptr;
  int iVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  OverheadTest test;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff78;
  AssertHelper local_80;
  char local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  upb_Arena *in_stack_ffffffffffffff98;
  double in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  
  OverheadTest::OverheadTest((OverheadTest *)&stack0xffffffffffffff98,0,0);
  uVar1 = upb_Arena_SpaceAllocated(in_stack_ffffffffffffff98,(size_t *)0x0);
  iVar2 = 10;
  do {
    OverheadTest::Alloc((OverheadTest *)&stack0xffffffffffffff98,uVar1 * 2 + 1);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  upb_Arena_SpaceAllocated(in_stack_ffffffffffffff98,(size_t *)0x0);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff78._M_head_impl,(char *)0x16ef4e,
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(double)in_stack_ffffffffffffff98,
             (double)in_stack_ffffffffffffff90);
  if (local_78 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff78);
    if (in_stack_ffffffffffffff90 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (in_stack_ffffffffffffff90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc"
               ,0x102,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff78._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffff90 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff90,in_stack_ffffffffffffff90);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
              *)&stack0xffffffffffffffa0);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff78._M_head_impl,(char *)0x16f036,
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(double)in_stack_ffffffffffffff98,
             (double)in_stack_ffffffffffffff90);
  if (local_78 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff78);
    if (in_stack_ffffffffffffff90 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (in_stack_ffffffffffffff90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc"
               ,0x103,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )in_stack_ffffffffffffff78._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff78._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffff90 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff90,in_stack_ffffffffffffff90);
  }
  OverheadTest::~OverheadTest((OverheadTest *)&stack0xffffffffffffff98);
  return;
}

Assistant:

TEST(OverheadTest, SmallBlocksLargerThanInitial) {
  OverheadTest test;
  size_t initial_block_size = upb_Arena_SpaceAllocated(test.arena_, nullptr);
  for (int i = 0; i < 10; i++) {
    test.Alloc(initial_block_size * 2 + 1);
  }
  if (!UPB_ASAN && sizeof(void*) == 8) {
    EXPECT_NEAR(test.WastePct(), 0.37, 0.025);
    EXPECT_NEAR(test.AmortizedAlloc(), 0.5, 0.025);
  }
}